

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeContainerFormatParser.cpp
# Opt level: O2

void __thiscall xe::ContainerFormatParser::parseContainerLine(ContainerFormatParser *this)

{
  char cVar1;
  char *pcVar2;
  bool bVar3;
  int iVar4;
  ContainerElement CVar5;
  int iVar6;
  long lVar7;
  undefined8 extraout_RAX;
  int offset;
  ContainerFormatParser *pCVar8;
  int iVar9;
  allocator<char> local_65;
  int local_64;
  undefined8 local_40;
  undefined8 local_38;
  
  iVar6 = this->m_elementLen;
  lVar7 = 0;
  while (lVar7 != 6) {
    local_40 = parseContainerLine::s_elements + lVar7;
    pcVar2 = parseContainerLine::s_elements[lVar7].name;
    iVar9 = 0;
    local_38 = lVar7;
    do {
      offset = iVar9 + 1;
      bVar3 = true;
      if (offset < iVar6) {
        iVar4 = getChar(this,offset);
        if ((0x21 < iVar4 + 1U) || ((0x200004803U >> ((ulong)(iVar4 + 1U) & 0x3f) & 1) == 0)) {
          bVar3 = false;
        }
      }
      else {
        iVar4 = 0;
      }
      cVar1 = pcVar2[iVar9];
      if ((bVar3) || (cVar1 == '\0')) {
        if (!(bool)(bVar3 ^ cVar1 == '\0')) {
          CVar5 = *(ContainerElement *)(local_40 + 8);
          this->m_element = CVar5;
          iVar9 = iVar9 + 1;
          goto LAB_0011483a;
        }
        break;
      }
      iVar9 = offset;
    } while (iVar4 == cVar1);
    lVar7 = local_38 + 1;
  }
  CVar5 = this->m_element;
  iVar9 = 1;
LAB_0011483a:
  if (CVar5 < CONTAINERELEMENT_TEST_LOG_DATA) {
    if ((0x4cU >> (CVar5 & 0x1f) & 1) != 0) {
      return;
    }
    if ((0xa0U >> (CVar5 & 0x1f) & 1) == 0) {
      if (CVar5 != CONTAINERELEMENT_SESSION_INFO) goto LAB_00114939;
      iVar6 = getChar(this,iVar9);
      if (iVar6 != 0x20) goto LAB_00114980;
      local_64 = iVar9 + 1;
      parseContainerValue(this,&this->m_attribute,&local_64);
      iVar6 = local_64;
      iVar9 = getChar(this,local_64);
      if (iVar9 != 0x20) goto LAB_001149a0;
      iVar6 = iVar6 + 1;
      local_64 = iVar6;
      bVar3 = std::operator==(&this->m_attribute,"timestamp");
      if (bVar3) {
        (this->m_value)._M_string_length = 0;
        *(this->m_value)._M_dataplus._M_p = '\0';
        while( true ) {
          if (this->m_elementLen <= iVar6) {
            return;
          }
          iVar9 = getChar(this,iVar6);
          if ((iVar9 + 1U < 0xc) && ((0xc03U >> (iVar9 + 1U & 0x1f) & 1) != 0)) break;
          std::__cxx11::string::push_back((char)this + '0');
          iVar6 = iVar6 + 1;
        }
        return;
      }
    }
    else {
      iVar6 = getChar(this,iVar9);
      if (iVar6 != 0x20) {
        pCVar8 = (ContainerFormatParser *)&stack0xffffffffffffffa0;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)pCVar8,"Expected value after instruction",&local_65);
        error(pCVar8,(string *)&stack0xffffffffffffffa0);
LAB_00114980:
        pCVar8 = (ContainerFormatParser *)&stack0xffffffffffffffa0;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)pCVar8,"Expected attribute name after #sessionInfo",&local_65);
        error(pCVar8,(string *)&stack0xffffffffffffffa0);
LAB_001149a0:
        pCVar8 = (ContainerFormatParser *)&stack0xffffffffffffffa0;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)pCVar8,"No value for #sessionInfo attribute",&local_65);
        error(pCVar8,(string *)&stack0xffffffffffffffa0);
        std::__cxx11::string::~string((string *)&stack0xffffffffffffffa0);
        _Unwind_Resume(extraout_RAX);
      }
      local_64 = iVar9 + 1;
    }
    parseContainerValue(this,&this->m_value,&local_64);
  }
  else {
LAB_00114939:
    this->m_element = CONTAINERELEMENT_TEST_LOG_DATA;
  }
  return;
}

Assistant:

void ContainerFormatParser::parseContainerLine (void)
{
	static const struct
	{
		const char*			name;
		ContainerElement	element;
	} s_elements[] =
	{
		{ "beginTestCaseResult",		CONTAINERELEMENT_BEGIN_TEST_CASE_RESULT		},
		{ "endTestCaseResult",			CONTAINERELEMENT_END_TEST_CASE_RESULT		},
		{ "terminateTestCaseResult",	CONTAINERELEMENT_TERMINATE_TEST_CASE_RESULT	},
		{ "sessionInfo",				CONTAINERELEMENT_SESSION_INFO				},
		{ "beginSession",				CONTAINERELEMENT_BEGIN_SESSION				},
		{ "endSession",					CONTAINERELEMENT_END_SESSION				}
	};

	DE_ASSERT(m_elementLen >= 1);
	DE_ASSERT(getChar(0) == '#');

	int offset = 1;

	for (int elemNdx = 0; elemNdx < DE_LENGTH_OF_ARRAY(s_elements); elemNdx++)
	{
		bool	isMatch	= false;
		int		ndx		= 0;

		for (;;)
		{
			int		bufChar		= (offset+ndx < m_elementLen) ? getChar(offset+ndx) : 0;
			bool	bufEnd		= bufChar == 0 || bufChar == ' ' || bufChar == '\r' || bufChar == '\n' || bufChar == (int)END_OF_BUFFER;
			int		elemChar	= s_elements[elemNdx].name[ndx];
			bool	elemEnd		= elemChar == 0;

			if (bufEnd || elemEnd)
			{
				isMatch = bufEnd == elemEnd;
				break;
			}
			else if (bufChar != elemChar)
				break;

			ndx += 1;
		}

		if (isMatch)
		{
			m_element	 = s_elements[elemNdx].element;
			offset		+= ndx;
			break;
		}
	}

	switch (m_element)
	{
		case CONTAINERELEMENT_BEGIN_SESSION:
		case CONTAINERELEMENT_END_SESSION:
		case CONTAINERELEMENT_END_TEST_CASE_RESULT:
			break; // No attribute or value.

		case CONTAINERELEMENT_BEGIN_TEST_CASE_RESULT:
		case CONTAINERELEMENT_TERMINATE_TEST_CASE_RESULT:
			if (getChar(offset) != ' ')
				error("Expected value after instruction");
			offset += 1;
			parseContainerValue(m_value, offset);
			break;

		case CONTAINERELEMENT_SESSION_INFO:
			if (getChar(offset) != ' ')
				error("Expected attribute name after #sessionInfo");
			offset += 1;
			parseContainerValue(m_attribute, offset);
			if (getChar(offset) != ' ')
				error("No value for #sessionInfo attribute");
			offset += 1;

			if (m_attribute == "timestamp")
			{
				m_value.clear();

				// \note Candy produces unescaped timestamps.
				for (;;)
				{
					const int	curChar	= offset < m_elementLen ? getChar(offset) : 0;
					const bool	isEnd	= curChar == 0 || curChar == (int)END_OF_BUFFER || curChar == '\n' || curChar == '\t';

					if (isEnd)
						break;
					else
						m_value.push_back((char)curChar);

					offset += 1;
				}
			}
			else
				parseContainerValue(m_value, offset);
			break;

		default:
			// \todo [2012-06-09 pyry] Implement better way to handle # at the beginning of log lines.
			m_element = CONTAINERELEMENT_TEST_LOG_DATA;
			break;
	}
}